

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

ByteData256 *
cfd::CreateTxSighash
          (ByteData256 *__return_storage_ptr__,TransactionContext *transaction,OutPoint *outpoint,
          UtxoData *utxo,SigHashType *sighash_type,Pubkey *pubkey,Script *redeem_script,
          WitnessVersion version,ByteData *annex,TaprootScriptTree *script_tree)

{
  char cVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this;
  ByteData sig;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  SigHashType local_60 [12];
  SigHashType local_54 [12];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  cfd::core::ByteData::ByteData((ByteData *)&local_78);
  if (version == kVersion1) {
    this = &local_90;
    cfd::core::ByteData256::ByteData256((ByteData256 *)this);
    if (script_tree == (TaprootScriptTree *)0x0) {
      this = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    }
    else {
      cfd::core::TaprootScriptTree::GetTapLeafHash();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_48);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    }
    TransactionContext::CreateSignatureHashByTaproot
              (__return_storage_ptr__,transaction,outpoint,sighash_type,(ByteData256 *)this,
               (uint32_t *)0x0,annex);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
  }
  else {
    cVar1 = cfd::core::Script::IsEmpty();
    if (cVar1 == '\0') {
      cfd::core::SigHashType::SigHashType(local_60,sighash_type);
      (**(code **)(*(long *)transaction + 0xa0))
                (&local_90,transaction,outpoint,redeem_script,local_60,&utxo->amount,
                 CONCAT44(uVar2,version));
    }
    else {
      cfd::core::SigHashType::SigHashType(local_54,sighash_type);
      (**(code **)(*(long *)transaction + 0x98))
                (&local_90,transaction,outpoint,pubkey,local_54,&utxo->amount,
                 CONCAT44(uVar2,version));
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&local_90);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
    cfd::core::ByteData256::ByteData256(__return_storage_ptr__,(ByteData *)&local_78);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
  return __return_storage_ptr__;
}

Assistant:

static ByteData256 CreateTxSighash(
    const TransactionContext* transaction, const OutPoint& outpoint,
    const UtxoData& utxo, const SigHashType& sighash_type,
    const Pubkey& pubkey, const Script& redeem_script, WitnessVersion version,
    const ByteData* annex, const TaprootScriptTree* script_tree) {
  ByteData sig;
  if (version == WitnessVersion::kVersion1) {
    ByteData256 tapleaf_hash;
    if (script_tree != nullptr) tapleaf_hash = script_tree->GetTapLeafHash();
    return transaction->CreateSignatureHashByTaproot(
        outpoint, sighash_type,
        (script_tree != nullptr) ? &tapleaf_hash : nullptr, 0, annex);
  } else if (redeem_script.IsEmpty()) {
    sig = transaction->CreateSignatureHash(
        outpoint, pubkey, sighash_type, utxo.amount, version);
  } else {
    sig = transaction->CreateSignatureHash(
        outpoint, redeem_script, sighash_type, utxo.amount, version);
  }
  return ByteData256(sig);
}